

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

void Gia_ManLutSat(Gia_Man_t *pGia,int LutSize,int nNumber,int nImproves,int nBTLimit,int DelayMax,
                  int nEdges,int fDelay,int fReverse,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Sbl_Man_t *p_00;
  Sbl_Man_t *p;
  int local_28;
  int nImproveCount;
  int iLut;
  int DelayMax_local;
  int nBTLimit_local;
  int nImproves_local;
  int nNumber_local;
  int LutSize_local;
  Gia_Man_t *pGia_local;
  
  p._4_4_ = 0;
  p_00 = Sbl_ManAlloc(pGia,nNumber);
  p_00->LutSize = LutSize;
  p_00->nBTLimit = nBTLimit;
  p_00->DelayMax = DelayMax;
  p_00->nEdges = nEdges;
  p_00->fDelay = fDelay;
  p_00->fReverse = fReverse;
  p_00->fVerbose = fVerbose | fVeryVerbose;
  p_00->fVeryVerbose = fVeryVerbose;
  if (p_00->fVerbose != 0) {
    printf("Parameters: WinSize = %d AIG nodes.  Conf = %d.  DelayMax = %d.\n",
           (ulong)(uint)p_00->nVars,(ulong)(uint)p_00->nBTLimit,(ulong)(uint)p_00->DelayMax);
  }
  if (((fDelay != 0) && (pGia->vEdge1 != (Vec_Int_t *)0x0)) && (p_00->DelayMax == 0)) {
    iVar1 = Gia_ManEvalEdgeDelay(pGia);
    p_00->DelayMax = iVar1;
  }
  Gia_ManComputeOneWinStart(pGia,nNumber,fReverse);
  local_28 = 1;
  while ((iVar1 = Gia_ManObjNum(pGia), local_28 < iVar1 &&
         (((iVar1 = Gia_ObjIsLut2(pGia,local_28), iVar1 == 0 ||
           (iVar1 = Sbl_ManTestSat(p_00,local_28), iVar1 != 2)) ||
          (p._4_4_ = p._4_4_ + 1, p._4_4_ != nImproves))))) {
    local_28 = local_28 + 1;
  }
  Gia_ManComputeOneWin
            (pGia,-1,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
  if (p_00->fVerbose != 0) {
    printf("Tried = %d. Used = %d. HashWin = %d. SmallWin = %d. LargeWin = %d. IterOut = %d.  SAT runs = %d.\n"
           ,(ulong)(uint)p_00->nTried,(ulong)(uint)p_00->nImproved,(ulong)(uint)p_00->nHashWins,
           (ulong)(uint)p_00->nSmallWins,(ulong)(uint)p_00->nLargeWins,p_00->nIterOuts,p_00->nRuns);
  }
  if (p_00->fVerbose != 0) {
    Sbl_ManPrintRuntime(p_00);
  }
  Sbl_ManStop(p_00);
  Vec_IntFreeP(&pGia->vPacking);
  return;
}

Assistant:

void Gia_ManLutSat( Gia_Man_t * pGia, int LutSize, int nNumber, int nImproves, int nBTLimit, int DelayMax, int nEdges, int fDelay, int fReverse, int fVerbose, int fVeryVerbose )
{
    int iLut, nImproveCount = 0;
    Sbl_Man_t * p   = Sbl_ManAlloc( pGia, nNumber );
    p->LutSize      = LutSize;      // LUT size
    p->nBTLimit     = nBTLimit;     // conflicts
    p->DelayMax     = DelayMax;     // external delay
    p->nEdges       = nEdges;       // the number of edges
    p->fDelay       = fDelay;       // delay mode
    p->fReverse     = fReverse;     // reverse windowing
    p->fVerbose     = fVerbose | fVeryVerbose;
    p->fVeryVerbose = fVeryVerbose;
    if ( p->fVerbose )
    printf( "Parameters: WinSize = %d AIG nodes.  Conf = %d.  DelayMax = %d.\n", p->nVars, p->nBTLimit, p->DelayMax );
    // determine delay limit
    if ( fDelay && pGia->vEdge1 && p->DelayMax == 0 )
        p->DelayMax = Gia_ManEvalEdgeDelay( pGia );
    // iterate through the internal nodes
    Gia_ManComputeOneWinStart( pGia, nNumber, fReverse );
    Gia_ManForEachLut2( pGia, iLut )
    {
        if ( Sbl_ManTestSat( p, iLut ) != 2 )
            continue;
        if ( ++nImproveCount == nImproves )
            break;
    }
    Gia_ManComputeOneWin( pGia, -1, NULL, NULL, NULL, NULL );
    if ( p->fVerbose )
    printf( "Tried = %d. Used = %d. HashWin = %d. SmallWin = %d. LargeWin = %d. IterOut = %d.  SAT runs = %d.\n", 
        p->nTried, p->nImproved, p->nHashWins, p->nSmallWins, p->nLargeWins, p->nIterOuts, p->nRuns );
    if ( p->fVerbose )
    Sbl_ManPrintRuntime( p );
    Sbl_ManStop( p );
    Vec_IntFreeP( &pGia->vPacking );
}